

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.c
# Opt level: O0

void map_background(xchar x,xchar y,int show)

{
  uint bg;
  undefined8 uStack_2c;
  rm tmp_loc;
  rm *loc;
  int cmap;
  int show_local;
  xchar y_local;
  xchar x_local;
  
  bg = back_to_cmap(level,x,y);
  tmp_loc._4_8_ = level->locations[x] + y;
  if ((*(uint *)&(level->flags).field_0x8 >> 0xe & 1) == 0) {
    uStack_2c = *(undefined8 *)tmp_loc._4_8_;
    tmp_loc._0_4_ = *(undefined4 *)&((rm *)tmp_loc._4_8_)->field_0x8;
    tmp_loc._4_8_ = &uStack_2c;
  }
  *(uint *)tmp_loc._4_8_ = *(uint *)tmp_loc._4_8_ & 0xffffffc0 | bg & 0x3f;
  if ((((bg != 0x19) && (bg != 0x1a)) && (bg != 0x1b)) && (bg != 0x1c)) {
    *(uint *)(tmp_loc._4_8_ + 6) = *(uint *)(tmp_loc._4_8_ + 6) & 0xfffffffe;
    *(uint *)(tmp_loc._4_8_ + 6) = *(uint *)(tmp_loc._4_8_ + 6) & 0xfffffffd;
  }
  if (show != 0) {
    dbuf_set(level,(int)x,(int)y,(rm *)tmp_loc._4_8_,bg,0,0,0,0,0,0,0,0,0);
  }
  return;
}

Assistant:

void map_background(xchar x, xchar y, int show)
{
    int cmap = back_to_cmap(level, x, y);
    struct rm *loc = &level->locations[x][y];
    struct rm tmp_loc;

    if (!level->flags.hero_memory) {
	tmp_loc = *loc;
	loc = &tmp_loc;
    }

    loc->mem_bg = cmap;
    if (cmap == S_vodoor || cmap == S_hodoor ||
	cmap == S_vcdoor || cmap == S_hcdoor) {
	/* leave memory alone, it'll be 0 if this wasn't
	 * remembered as a door */
    } else {
	loc->mem_door_l = 0;
	loc->mem_door_t = 0;
    }

    if (show)
	dbuf_set(level, x, y, loc, cmap, 0, 0, 0, 0, 0, 0, 0, 0, 0);
}